

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O3

void __thiscall
choc::text::FloatToStringBuffer<double>::Limits::Limits(Limits *this,MantissaAndExponent value)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar4 = value.mantissa;
  uVar5 = uVar4 * 2 + 1;
  iVar1 = value.exponent;
  iVar6 = iVar1 + -1;
  if ((uVar4 >> 0x34 & 1) == 0) {
    lVar3 = 0x3f;
    if ((uVar5 & 0x1fffffffffffff) != 0) {
      for (; (uVar5 & 0x1fffffffffffff) >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar5 = uVar5 << (~(byte)lVar3 + 0x36 & 0x3f);
    iVar6 = (iVar1 - ((uint)lVar3 ^ 0x3f)) + 9;
  }
  iVar6 = iVar6 + -10;
  iVar2 = iVar1 + -1;
  if (uVar4 == 0x10000000000000) {
    iVar2 = iVar1 + -2;
  }
  lVar3 = 0x3fffffffffffff;
  if (uVar4 != 0x10000000000000) {
    lVar3 = uVar4 * 2 + -1;
  }
  (this->upper).mantissa = uVar5 << 10;
  (this->upper).exponent = iVar6;
  (this->lower).mantissa = lVar3 << ((char)iVar2 - (char)iVar6 & 0x3fU);
  (this->lower).exponent = iVar6;
  return;
}

Assistant:

constexpr Limits (MantissaAndExponent value)
        {
            upper = { (value.mantissa << 1) + 1, value.exponent - 1 };

            while ((upper.mantissa & (hiddenBit << 1)) == 0)
                upper = upper.shiftedUp (1);

            upper = upper.shiftedUp (static_cast<int> (sizeof (upper.mantissa) * 8 - numSignificandBits - 2));

            lower = value.mantissa == hiddenBit ? MantissaAndExponent { (value.mantissa << 2) - 1, value.exponent - 2 }
                                                : MantissaAndExponent { (value.mantissa << 1) - 1, value.exponent - 1 };
            lower.mantissa <<= lower.exponent - upper.exponent;
            lower.exponent = upper.exponent;
        }